

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

vm_strbuf_ext * vm_strbuf_ext::alloc_ext(CVmObjStringBuffer *self,int32_t alo,int32_t inc)

{
  int iVar1;
  undefined4 extraout_var;
  vm_strbuf_ext *pvVar2;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,(long)(alo * 4 + 0xc),self);
  pvVar2 = (vm_strbuf_ext *)CONCAT44(extraout_var,iVar1);
  pvVar2->alo = alo;
  pvVar2->inc = inc;
  pvVar2->len = 0;
  return pvVar2;
}

Assistant:

vm_strbuf_ext *vm_strbuf_ext::alloc_ext(VMG_ CVmObjStringBuffer *self,
                                        int32_t alo, int32_t inc)
{
    /* calculate how much space we need */
    int32_t siz = sizeof(vm_strbuf_ext) + (alo-1)*sizeof(wchar_t);

    /* allocate the memory */
    vm_strbuf_ext *ext = (vm_strbuf_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* remember the sizes */
    ext->alo = alo;
    ext->inc = inc;

    /* the buffer is currently empty */
    ext->len = 0;

    /* return the new extension */
    return ext;
}